

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O0

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar6;
  double dVar7;
  sunindextype i;
  sunrealtype c2;
  sunrealtype c1;
  sunrealtype *Ydot;
  sunrealtype *Y;
  sunrealtype dx;
  sunrealtype k;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  long lVar8;
  void *in_stack_ffffffffffffff98;
  int local_4;
  
  lVar2 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  dVar7 = (double)in_RDX[1];
  pdVar4 = (double *)N_VGetArrayPointer(in_RDI);
  iVar3 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
  if (iVar3 == 0) {
    pdVar5 = (double *)N_VGetArrayPointer(in_RSI);
    iVar3 = check_retval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff8c);
    if (iVar3 == 0) {
      dVar6 = (dVar1 / dVar7) / dVar7;
      dVar7 = ((dVar1 * 2.0) / dVar7) / dVar7;
      *pdVar5 = dVar7 * (pdVar4[1] - *pdVar4);
      for (lVar8 = 1; lVar8 < lVar2 + -1; lVar8 = lVar8 + 1) {
        pdVar5[lVar8] =
             dVar6 * pdVar4[lVar8 + 1] + dVar6 * pdVar4[lVar8 + -1] + -(dVar7 * pdVar4[lVar8]);
      }
      pdVar5[lVar2 + -1] = dVar7 * (pdVar4[lVar2 + -2] - pdVar4[lVar2 + -1]);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing diffusion term */
  c1 = k / dx / dx;
  c2 = SUN_RCONST(2.0) * k / dx / dx;

  /* left boundary condition */
  Ydot[0] = c2 * (Y[1] - Y[0]);

  /* interior points */
  for (i = 1; i < N - 1; i++)
  {
    Ydot[i] = c1 * Y[i - 1] - c2 * Y[i] + c1 * Y[i + 1];
  }

  /* right boundary condition */
  Ydot[N - 1] = c2 * (Y[N - 2] - Y[N - 1]);

  /* Return with success */
  return 0;
}